

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O1

int Res_FilterCandidates
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax,int fArea)

{
  void **ppvVar1;
  void *pvVar2;
  void *Entry;
  byte bVar3;
  long lVar4;
  uint *puVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  int local_9c;
  ulong local_70;
  long local_58;
  long local_50;
  
  if (pSim->vOuts->nSize < 2) {
LAB_0048147d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar18 = (ulong)(uint)pSim->nWordsOut;
  do {
    iVar8 = (int)uVar18;
    if (iVar8 < 1) goto LAB_00480a0d;
    lVar11 = uVar18 * 4;
    uVar18 = uVar18 - 1;
  } while (*(int *)((long)pSim->vOuts->pArray[1] + lVar11 + -4) == -1);
  if (iVar8 < 1) {
LAB_00480a0d:
    puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    uVar18 = (ulong)(uint)pSim->nWordsOut;
    do {
      iVar8 = (int)uVar18;
      if (iVar8 < 1) goto LAB_00480a53;
      lVar11 = uVar18 - 1;
      uVar18 = uVar18 - 1;
    } while (puVar5[lVar11] == 0xffffffff);
    if (iVar8 < 1) {
LAB_00480a53:
      iVar8 = vResubs->nSize;
      if (0 < (long)iVar8) {
        ppvVar1 = vResubs->pArray;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)ppvVar1[lVar11] + 4) = 0;
          lVar11 = lVar11 + 1;
        } while (iVar8 != lVar11);
      }
      iVar8 = vResubsW->nSize;
      if (0 < (long)iVar8) {
        ppvVar1 = vResubsW->pArray;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)ppvVar1[lVar11] + 4) = 0;
          lVar11 = lVar11 + 1;
        } while (iVar8 != lVar11);
      }
      pAVar7 = pWin->pNode;
      if ((pAVar7->vFanins).nSize < 1) {
        local_9c = 0;
      }
      else {
        lVar11 = 0;
        local_9c = 0;
        do {
          if ((fArea == 0) ||
             (*(int *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar11]] + 0x2c) <
              2)) {
            bVar3 = (byte)lVar11 & 0x1f;
            puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3)
            ;
            uVar18 = (ulong)(uint)pSim->nWordsOut;
            do {
              iVar8 = (int)uVar18;
              if (iVar8 < 1) goto LAB_00480b2a;
              lVar12 = uVar18 - 1;
              uVar18 = uVar18 - 1;
            } while (puVar5[lVar12] == 0xffffffff);
            if (iVar8 < 1) {
LAB_00480b2a:
              if (pAig->vPos->nSize < 1) goto LAB_0048147d;
              Vec_VecPush(vResubs,local_9c,*pAig->vPos->pArray);
              if (pAig->vPos->nSize < 2) goto LAB_0048147d;
              Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[1]);
              pAVar7 = pWin->pNode;
              if (0 < (pAVar7->vFanins).nSize) {
                lVar12 = 0;
                do {
                  if (lVar11 != lVar12) {
                    if (pAig->vPos->nSize <= (int)lVar12 + 2) goto LAB_0048147d;
                    pvVar2 = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar12]];
                    Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[lVar12 + 2]);
                    Vec_VecPush(vResubsW,local_9c,pvVar2);
                  }
                  lVar12 = lVar12 + 1;
                  pAVar7 = pWin->pNode;
                } while (lVar12 < (pAVar7->vFanins).nSize);
              }
              local_9c = local_9c + 1;
              if (local_9c == vResubs->nSize) {
                return local_9c;
              }
            }
          }
          lVar11 = lVar11 + 1;
          pAVar7 = pWin->pNode;
        } while (lVar11 < (pAVar7->vFanins).nSize);
      }
      pAVar7 = pWin->pNode;
      iVar8 = (pAVar7->vFanins).nSize;
      if (0 < iVar8) {
        lVar11 = 0;
        do {
          if (*(int *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar11]] + 0x2c) <
              2) {
            bVar3 = (byte)lVar11 & 0x1f;
            puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3)
            ;
            iVar8 = (pWin->pNode->vFanins).nSize;
            uVar10 = iVar8 + 2;
            pVVar6 = pAig->vPos;
            iVar9 = pVVar6->nSize;
            if ((int)uVar10 < iVar9) {
              uVar18 = (ulong)uVar10;
              do {
                if (iVar8 < -2) goto LAB_0048147d;
                iVar17 = (int)uVar18;
                if (pSim->vOuts->nSize <= iVar17) goto LAB_0048147d;
                uVar10 = (iVar17 - (pWin->pNode->vFanins).nSize) - 2;
                uVar15 = (ulong)(uint)pSim->nWordsOut;
                do {
                  iVar13 = (int)uVar15;
                  if (iVar13 < 1) goto LAB_00480cf0;
                  lVar12 = uVar15 * 4;
                  lVar20 = uVar15 - 1;
                  uVar15 = uVar15 - 1;
                } while ((*(uint *)((long)pSim->vOuts->pArray[uVar18] + lVar12 + -4) |
                         puVar5[lVar20]) == 0xffffffff);
                if (iVar13 < 1) {
LAB_00480cf0:
                  if (iVar9 < 1) goto LAB_0048147d;
                  Vec_VecPush(vResubs,local_9c,*pVVar6->pArray);
                  if (pAig->vPos->nSize < 2) goto LAB_0048147d;
                  Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[1]);
                  pAVar7 = pWin->pNode;
                  if (0 < (pAVar7->vFanins).nSize) {
                    lVar12 = 0;
                    do {
                      if (lVar11 != lVar12) {
                        if (pAig->vPos->nSize <= (int)lVar12 + 2) goto LAB_0048147d;
                        pvVar2 = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar12]];
                        Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[lVar12 + 2]);
                        Vec_VecPush(vResubsW,local_9c,pvVar2);
                      }
                      lVar12 = lVar12 + 1;
                      pAVar7 = pWin->pNode;
                    } while (lVar12 < (pAVar7->vFanins).nSize);
                  }
                  if (((pAig->vPos->nSize <= iVar17) ||
                      (Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[uVar18]), (int)uVar10 < 0))
                     || (pWin->vDivs->nSize <= (int)uVar10)) goto LAB_0048147d;
                  Vec_VecPush(vResubsW,local_9c,pWin->vDivs->pArray[uVar10]);
                  local_9c = local_9c + 1;
                  if (local_9c == vResubs->nSize) {
                    return local_9c;
                  }
                }
                uVar18 = uVar18 + 1;
                pVVar6 = pAig->vPos;
                iVar9 = pVVar6->nSize;
              } while ((int)uVar18 < iVar9);
            }
          }
          lVar11 = lVar11 + 1;
          pAVar7 = pWin->pNode;
          iVar8 = (pAVar7->vFanins).nSize;
        } while (lVar11 < iVar8);
      }
      if ((iVar8 < nFaninsMax) && (pAVar7 = pWin->pNode, 0 < (pAVar7->vFanins).nSize)) {
        lVar11 = 0;
        do {
          if (*(int *)((long)pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar11]] + 0x2c) <
              2) {
            bVar3 = (byte)lVar11 & 0x1f;
            puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3)
            ;
            iVar8 = (pWin->pNode->vFanins).nSize;
            if ((int)(iVar8 + 2U) < pAig->vPos->nSize) {
              local_70 = (ulong)(iVar8 + 3);
              uVar18 = (ulong)(iVar8 + 2U);
              do {
                if (iVar8 < -2) goto LAB_0048147d;
                iVar9 = (int)uVar18;
                if (pSim->vOuts->nSize <= iVar9) goto LAB_0048147d;
                pVVar6 = pAig->vPos;
                iVar17 = pVVar6->nSize;
                iVar13 = (int)(uVar18 + 1);
                if (iVar13 < iVar17) {
                  pvVar2 = pSim->vOuts->pArray[uVar18];
                  uVar10 = (iVar9 - (pWin->pNode->vFanins).nSize) - 2;
                  uVar15 = local_70;
                  do {
                    if ((int)local_70 < 0) goto LAB_0048147d;
                    iVar19 = (int)uVar15;
                    if (pSim->vOuts->nSize <= iVar19) goto LAB_0048147d;
                    uVar21 = (iVar19 - (pWin->pNode->vFanins).nSize) - 2;
                    uVar16 = (ulong)(uint)pSim->nWordsOut;
                    do {
                      iVar14 = (int)uVar16;
                      if (iVar14 < 1) goto LAB_00480fb7;
                      lVar12 = uVar16 * 4;
                      lVar4 = uVar16 - 1;
                      lVar20 = uVar16 * 4;
                      uVar16 = uVar16 - 1;
                    } while ((*(uint *)((long)pvVar2 + lVar12 + -4) | puVar5[lVar4] |
                             *(uint *)((long)pSim->vOuts->pArray[uVar15] + lVar20 + -4)) ==
                             0xffffffff);
                    if (iVar14 < 1) {
LAB_00480fb7:
                      if (iVar17 < 1) goto LAB_0048147d;
                      Vec_VecPush(vResubs,local_9c,*pVVar6->pArray);
                      if (pAig->vPos->nSize < 2) goto LAB_0048147d;
                      Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[1]);
                      pAVar7 = pWin->pNode;
                      if (0 < (pAVar7->vFanins).nSize) {
                        lVar12 = 0;
                        do {
                          if (lVar11 != lVar12) {
                            if (pAig->vPos->nSize <= (int)lVar12 + 2) goto LAB_0048147d;
                            Entry = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar12]];
                            Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[lVar12 + 2]);
                            Vec_VecPush(vResubsW,local_9c,Entry);
                          }
                          lVar12 = lVar12 + 1;
                          pAVar7 = pWin->pNode;
                        } while (lVar12 < (pAVar7->vFanins).nSize);
                      }
                      if (pAig->vPos->nSize <= iVar9) goto LAB_0048147d;
                      Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[uVar18]);
                      if (((pAig->vPos->nSize <= iVar19) ||
                          (Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[uVar15]), (int)uVar10 < 0
                          )) || ((pWin->vDivs->nSize <= (int)uVar10 ||
                                 ((Vec_VecPush(vResubsW,local_9c,pWin->vDivs->pArray[uVar10]),
                                  (int)uVar21 < 0 || (pWin->vDivs->nSize <= (int)uVar21))))))
                      goto LAB_0048147d;
                      Vec_VecPush(vResubsW,local_9c,pWin->vDivs->pArray[uVar21]);
                      local_9c = local_9c + 1;
                      if (local_9c == vResubs->nSize) {
                        return local_9c;
                      }
                    }
                    uVar15 = uVar15 + 1;
                    pVVar6 = pAig->vPos;
                    iVar17 = pVVar6->nSize;
                  } while ((int)uVar15 < iVar17);
                }
                local_70 = local_70 + 1;
                uVar18 = uVar18 + 1;
              } while (iVar13 < pAig->vPos->nSize);
            }
          }
          lVar11 = lVar11 + 1;
          pAVar7 = pWin->pNode;
        } while (lVar11 < (pAVar7->vFanins).nSize);
      }
      if (fArea != 0) {
        return local_9c;
      }
      if ((pWin->pNode->vFanins).nSize < 1) {
        return local_9c;
      }
      local_50 = 1;
      local_58 = 0;
      do {
        lVar11 = local_58 + 1;
        if (lVar11 < (pWin->pNode->vFanins).nSize) {
          lVar12 = local_50;
          do {
            puVar5 = Res_FilterCollectFaninInfo
                               (pWin,pSim,
                                ~(1 << ((byte)local_58 & 0x1f) | 1 << ((uint)lVar12 & 0x1f)));
            iVar8 = (pWin->pNode->vFanins).nSize;
            uVar10 = iVar8 + 2;
            pVVar6 = pAig->vPos;
            iVar9 = pVVar6->nSize;
            if ((int)uVar10 < iVar9) {
              uVar18 = (ulong)uVar10;
              do {
                if (iVar8 < -2) goto LAB_0048147d;
                iVar17 = (int)uVar18;
                if (pSim->vOuts->nSize <= iVar17) goto LAB_0048147d;
                uVar10 = (iVar17 - (pWin->pNode->vFanins).nSize) - 2;
                uVar15 = (ulong)(uint)pSim->nWordsOut;
                do {
                  iVar13 = (int)uVar15;
                  if (iVar13 < 1) goto LAB_004812d6;
                  lVar20 = uVar15 * 4;
                  lVar4 = uVar15 - 1;
                  uVar15 = uVar15 - 1;
                } while ((*(uint *)((long)pSim->vOuts->pArray[uVar18] + lVar20 + -4) | puVar5[lVar4]
                         ) == 0xffffffff);
                if (iVar13 < 1) {
LAB_004812d6:
                  if (iVar9 < 1) goto LAB_0048147d;
                  Vec_VecPush(vResubs,local_9c,*pVVar6->pArray);
                  if (pAig->vPos->nSize < 2) goto LAB_0048147d;
                  Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[1]);
                  pAVar7 = pWin->pNode;
                  if (0 < (pAVar7->vFanins).nSize) {
                    lVar20 = 0;
                    do {
                      if (lVar12 != lVar20 && local_58 != lVar20) {
                        if (pAig->vPos->nSize <= (int)lVar20 + 2) goto LAB_0048147d;
                        pvVar2 = pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar20]];
                        Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[lVar20 + 2]);
                        Vec_VecPush(vResubsW,local_9c,pvVar2);
                      }
                      lVar20 = lVar20 + 1;
                      pAVar7 = pWin->pNode;
                    } while (lVar20 < (pAVar7->vFanins).nSize);
                  }
                  if (((pAig->vPos->nSize <= iVar17) ||
                      (Vec_VecPush(vResubs,local_9c,pAig->vPos->pArray[uVar18]), (int)uVar10 < 0))
                     || (pWin->vDivs->nSize <= (int)uVar10)) goto LAB_0048147d;
                  Vec_VecPush(vResubsW,local_9c,pWin->vDivs->pArray[uVar10]);
                  local_9c = local_9c + 1;
                  if (local_9c == vResubs->nSize) {
                    return local_9c;
                  }
                }
                uVar18 = uVar18 + 1;
                pVVar6 = pAig->vPos;
                iVar9 = pVVar6->nSize;
              } while ((int)uVar18 < iVar9);
            }
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 < (pWin->pNode->vFanins).nSize);
        }
        local_50 = local_50 + 1;
        local_58 = lVar11;
        if ((pWin->pNode->vFanins).nSize <= lVar11) {
          return local_9c;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int Res_FilterCandidates( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax, int fArea )
{
    Abc_Obj_t * pFanin, * pFanin2, * pFaninTemp;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, i, i2, d, d2, iDiv, iDiv2, k;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing each fanin
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( fArea && Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
        if ( RetValue )
        {
//            printf( "Node %4d. Candidate fanin %4d.\n", pWin->pNode->Id, pFanin->Id );
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;    
        }
    }

    // try replacing each critical fanin by a non-critical fanin
    Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
    {
        if ( Abc_ObjFanoutNum(pFanin) > 1 )
            continue;
        // get simulation info without this fanin
        pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
        // go over the set of divisors
        for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
        {
            pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
            iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
            if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
            {
                if ( k != i )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFaninTemp );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Counter++;
            if ( Counter == Vec_VecSize(vResubs) )
                return Counter;           
        }
    }

    // consider the case when two fanins can be added instead of one
    if ( Abc_ObjFaninNum(pWin->pNode) < nFaninsMax )
    {
        // try to replace each critical fanin by two non-critical fanins
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            if ( Abc_ObjFanoutNum(pFanin) > 1 )
                continue;
            // get simulation info without this fanin
            pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << i) );
            // go over the set of divisors
            for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
            {
                pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                // go through the second divisor
                for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
                {
                    pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
                    iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }

    // try to replace two nets by one
    if ( !fArea )
    {
        Abc_ObjForEachFanin( pWin->pNode, pFanin, i )
        {
            for ( i2 = i + 1; i2 < Abc_ObjFaninNum(pWin->pNode); i2++ )
            {
                pFanin2 = Abc_ObjFanin(pWin->pNode, i2);
                // get simulation info without these fanins
                pInfo = Res_FilterCollectFaninInfo( pWin, pSim, (~(1 << i)) & (~(1 << i2)) );
                // go over the set of divisors
                for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
                {
                    pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
                    iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
                    if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
                        continue;
                    // collect the nodes
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
                    // collect the remaning fanins and the divisor
                    Abc_ObjForEachFanin( pWin->pNode, pFaninTemp, k )
                    {
                        if ( k != i && k != i2 )
                        {
                            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                            Vec_VecPush( vResubsW, Counter, pFaninTemp );
                        }
                    }
                    // collect the divisor
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
                    Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
                    Counter++;
                    if ( Counter == Vec_VecSize(vResubs) )
                        return Counter;           
                }
            }
        }
    }
    return Counter;
}